

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

uint32_t crc32(uint32_t crc,void *buf,size_t size)

{
  byte *local_28;
  uint8_t *p;
  size_t size_local;
  void *buf_local;
  uint32_t crc_local;
  
  buf_local._4_4_ = crc ^ 0xffffffff;
  local_28 = (byte *)buf;
  p = (uint8_t *)size;
  while (p != (uint8_t *)0x0) {
    buf_local._4_4_ = crc32_tab[(buf_local._4_4_ ^ ""[*local_28]) & 0xff] ^ buf_local._4_4_ >> 8;
    local_28 = local_28 + 1;
    p = p + -1;
  }
  return buf_local._4_4_ ^ 0xffffffff;
}

Assistant:

uint32_t crc32(uint32_t crc, const void *buf, size_t size)
{
    const uint8_t *p;

    p = (uint8_t*)buf;
    crc = crc ^ ~0U;

    while (size--)
        crc = crc32_tab[(crc ^ BitReverseTable[*p++]) & 0xFF] ^ (crc >> 8);

  return crc ^ ~0U;
}